

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TextureCubeLodControlCase::TextureCubeLodControlCase
          (TextureCubeLodControlCase *this,Context *context,char *name,char *desc,deUint32 minFilter
          )

{
  RenderContext *context_00;
  TestContext *this_00;
  TestLog *log;
  deUint32 minFilter_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TextureCubeLodControlCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeLodControlCase_01596260;
  this->m_texSize = 0x40;
  this->m_minFilter = minFilter;
  this->m_texture = (TextureCube *)0x0;
  context_00 = Context::getRenderContext(context);
  this_00 = Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_00);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context_00,log,GLSL_VERSION_300_ES,PRECISION_HIGHP);
  return;
}

Assistant:

TextureCubeLodControlCase::TextureCubeLodControlCase (Context& context, const char* name, const char* desc, deUint32 minFilter)
	: TestCase			(context, name, desc)
	, m_texSize			(64)
	, m_minFilter		(minFilter)
	, m_texture			(DE_NULL)
	, m_renderer		(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
{
}